

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexSubImage3DParamsCase::createTexture(TexSubImage3DParamsCase *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 internalFormat;
  int iVar4;
  int iVar5;
  int depth;
  deInt32 rowPitch_00;
  TransferFormat TVar6;
  reference pvVar7;
  int local_1ac;
  int local_1a8;
  PixelBufferAccess local_150;
  Vector<float,_4> local_128;
  Vector<float,_4> local_118;
  undefined1 local_108 [8];
  Vec4 colorB;
  Vector<float,_4> local_e8;
  undefined1 local_d8 [8];
  Vec4 colorA;
  Vec4 cBias;
  Vec4 cScale;
  int slicePitch_1;
  int imageHeight;
  int rowPitch_1;
  int rowLength;
  int local_6c;
  int local_68;
  int slicePitch;
  int rowPitch;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  int pixelSize;
  deUint32 local_30;
  deUint32 dStack_2c;
  TransferFormat transferFmt;
  TexSubImage3DParamsCase *this_local;
  
  TVar6 = glu::getTransferFormat((this->super_Texture3DSpecCase).m_texFormat);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       tcu::TextureFormat::getPixelSize(&(this->super_Texture3DSpecCase).m_texFormat);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806f,
             (deUint32)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  local_68 = deAlign32(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ *
                       (this->super_Texture3DSpecCase).m_width,4);
  local_6c = local_68 * (this->super_Texture3DSpecCase).m_height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
             (long)(local_6c * (this->super_Texture3DSpecCase).m_depth));
  iVar5 = local_68;
  iVar4 = local_6c;
  iVar1 = (this->super_Texture3DSpecCase).m_width;
  iVar2 = (this->super_Texture3DSpecCase).m_height;
  iVar3 = (this->super_Texture3DSpecCase).m_depth;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&rowPitch_1,&(this->super_Texture3DSpecCase).m_texFormat,iVar1,
             iVar2,iVar3,iVar5,iVar4,pvVar7);
  tcu::fillWithComponentGradients
            ((PixelBufferAccess *)&rowPitch_1,
             &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMin,
             &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMax);
  internalFormat = this->m_internalFormat;
  iVar1 = (this->super_Texture3DSpecCase).m_width;
  iVar2 = (this->super_Texture3DSpecCase).m_height;
  iVar3 = (this->super_Texture3DSpecCase).m_depth;
  local_30 = TVar6.format;
  dStack_2c = TVar6.dataType;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  sglr::ContextWrapper::glTexImage3D
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806f,0,
             internalFormat,iVar1,iVar2,iVar3,0,local_30,dStack_2c,pvVar7);
  if (this->m_rowLength < 1) {
    local_1a8 = this->m_subW;
  }
  else {
    local_1a8 = this->m_rowLength;
  }
  rowPitch_00 = deAlign32(local_1a8 *
                          data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,this->m_alignment)
  ;
  if (this->m_imageHeight < 1) {
    local_1ac = this->m_subH;
  }
  else {
    local_1ac = this->m_imageHeight;
  }
  local_1ac = local_1ac * rowPitch_00;
  tcu::operator-((tcu *)(cBias.m_data + 2),&(this->super_Texture3DSpecCase).m_texFormatInfo.valueMax
                 ,&(this->super_Texture3DSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colorA.m_data + 2),
             &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_e8,(Vector<float,_4> *)(colorB.m_data + 2),
                 (Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_d8,&local_e8,(Vector<float,_4> *)(colorA.m_data + 2));
  tcu::Vector<float,_4>::Vector(&local_128,0.0,1.0,0.0,1.0);
  tcu::operator*((tcu *)&local_118,&local_128,(Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_108,&local_118,(Vector<float,_4> *)(colorA.m_data + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
             (long)(local_1ac * ((this->super_Texture3DSpecCase).m_depth + this->m_skipImages)));
  iVar1 = this->m_subW;
  iVar2 = this->m_subH;
  iVar3 = this->m_subD;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_150,&(this->super_Texture3DSpecCase).m_texFormat,iVar1,iVar2,iVar3,rowPitch_00,
             local_1ac,
             pvVar7 + (long)(this->m_skipPixels *
                            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) +
                      (long)(this->m_skipRows * rowPitch_00) +
                      (long)(this->m_skipImages * local_1ac));
  tcu::fillWithGrid(&local_150,4,(Vec4 *)local_d8,(Vec4 *)local_108);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806e,
             this->m_imageHeight);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf2,
             this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806d,
             this->m_skipImages);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf3,
             this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf4,
             this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             this->m_alignment);
  iVar1 = this->m_subX;
  iVar2 = this->m_subY;
  iVar3 = this->m_subZ;
  iVar4 = this->m_subW;
  iVar5 = this->m_subH;
  depth = this->m_subD;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
  sglr::ContextWrapper::glTexSubImage3D
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806f,0,
             iVar1,iVar2,iVar3,iVar4,iVar5,depth,local_30,dStack_2c,pvVar7);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_3D, tex);

		// Fill with gradient.
		{
			int		rowPitch		= deAlign32(pixelSize*m_width,  4);
			int		slicePitch		= rowPitch*m_height;

			data.resize(slicePitch*m_depth);
			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, m_depth, rowPitch, slicePitch, &data[0]), m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
		}

		glTexImage3D(GL_TEXTURE_3D, 0, m_internalFormat, m_width, m_height, m_depth, 0, transferFmt.format, transferFmt.dataType, &data[0]);

		// Fill data with grid.
		{
			int		rowLength		= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
			int		imageHeight		= m_imageHeight > 0 ? m_imageHeight : m_subH;
			int		slicePitch		= imageHeight*rowPitch;
			Vec4	cScale			= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias			= m_texFormatInfo.valueMin;
			Vec4	colorA			= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB			= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(slicePitch*(m_depth+m_skipImages));
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, m_subD, rowPitch, slicePitch, &data[0] + m_skipImages*slicePitch + m_skipRows*rowPitch + m_skipPixels*pixelSize), 4, colorA, colorB);
		}

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	m_imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	m_skipImages);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);
		glTexSubImage3D(GL_TEXTURE_3D, 0, m_subX, m_subY, m_subZ, m_subW, m_subH, m_subD, transferFmt.format, transferFmt.dataType, &data[0]);
	}